

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O2

void cf_hash_drbg_sha256_init
               (cf_hash_drbg_sha256 *ctx,void *entropy,size_t nentropy,void *nonce,size_t nnonce,
               void *persn,size_t npersn)

{
  size_t unaff_RBX;
  uint7 uStack_10;
  uint8_t zero;
  
  ctx->V[0] = '\0';
  ctx->V[1] = '\0';
  ctx->V[2] = '\0';
  ctx->V[3] = '\0';
  ctx->V[4] = '\0';
  ctx->V[5] = '\0';
  ctx->V[6] = '\0';
  ctx->V[7] = '\0';
  ctx->V[8] = '\0';
  ctx->V[9] = '\0';
  ctx->V[10] = '\0';
  ctx->V[0xb] = '\0';
  ctx->V[0xc] = '\0';
  ctx->V[0xd] = '\0';
  ctx->V[0xe] = '\0';
  ctx->V[0xf] = '\0';
  ctx->C[0x29] = '\0';
  ctx->C[0x2a] = '\0';
  ctx->C[0x2b] = '\0';
  ctx->C[0x2c] = '\0';
  ctx->C[0x2d] = '\0';
  ctx->C[0x2e] = '\0';
  ctx->C[0x2f] = '\0';
  ctx->C[0x30] = '\0';
  *(undefined8 *)(ctx->C + 0x31) = 0;
  ctx->C[0x19] = '\0';
  ctx->C[0x1a] = '\0';
  ctx->C[0x1b] = '\0';
  ctx->C[0x1c] = '\0';
  ctx->C[0x1d] = '\0';
  ctx->C[0x1e] = '\0';
  ctx->C[0x1f] = '\0';
  ctx->C[0x20] = '\0';
  ctx->C[0x21] = '\0';
  ctx->C[0x22] = '\0';
  ctx->C[0x23] = '\0';
  ctx->C[0x24] = '\0';
  ctx->C[0x25] = '\0';
  ctx->C[0x26] = '\0';
  ctx->C[0x27] = '\0';
  ctx->C[0x28] = '\0';
  ctx->C[9] = '\0';
  ctx->C[10] = '\0';
  ctx->C[0xb] = '\0';
  ctx->C[0xc] = '\0';
  ctx->C[0xd] = '\0';
  ctx->C[0xe] = '\0';
  ctx->C[0xf] = '\0';
  ctx->C[0x10] = '\0';
  ctx->C[0x11] = '\0';
  ctx->C[0x12] = '\0';
  ctx->C[0x13] = '\0';
  ctx->C[0x14] = '\0';
  ctx->C[0x15] = '\0';
  ctx->C[0x16] = '\0';
  ctx->C[0x17] = '\0';
  ctx->C[0x18] = '\0';
  *(undefined8 *)(ctx->V + 0x30) = 0;
  ctx->C[1] = '\0';
  ctx->C[2] = '\0';
  ctx->C[3] = '\0';
  ctx->C[4] = '\0';
  ctx->C[5] = '\0';
  ctx->C[6] = '\0';
  ctx->C[7] = '\0';
  ctx->C[8] = '\0';
  ctx->V[0x20] = '\0';
  ctx->V[0x21] = '\0';
  ctx->V[0x22] = '\0';
  ctx->V[0x23] = '\0';
  ctx->V[0x24] = '\0';
  ctx->V[0x25] = '\0';
  ctx->V[0x26] = '\0';
  ctx->V[0x27] = '\0';
  ctx->V[0x28] = '\0';
  ctx->V[0x29] = '\0';
  ctx->V[0x2a] = '\0';
  ctx->V[0x2b] = '\0';
  ctx->V[0x2c] = '\0';
  ctx->V[0x2d] = '\0';
  ctx->V[0x2e] = '\0';
  ctx->V[0x2f] = '\0';
  ctx->V[0x10] = '\0';
  ctx->V[0x11] = '\0';
  ctx->V[0x12] = '\0';
  ctx->V[0x13] = '\0';
  ctx->V[0x14] = '\0';
  ctx->V[0x15] = '\0';
  ctx->V[0x16] = '\0';
  ctx->V[0x17] = '\0';
  ctx->V[0x18] = '\0';
  ctx->V[0x19] = '\0';
  ctx->V[0x1a] = '\0';
  ctx->V[0x1b] = '\0';
  ctx->V[0x1c] = '\0';
  ctx->V[0x1d] = '\0';
  ctx->V[0x1e] = '\0';
  ctx->V[0x1f] = '\0';
  ctx->reseed_counter = 0;
  hash_df((cf_chash *)entropy,(void *)nentropy,(size_t)nonce,(void *)nnonce,(size_t)persn,
          (void *)npersn,0,(void *)0x0,(size_t)ctx,(uint8_t *)CONCAT17(zero,uStack_10),unaff_RBX);
  zero = '\0';
  hash_df((cf_chash *)&zero,(void *)0x1,(size_t)ctx,(void *)0x37,0,(void *)0x0,0,(void *)0x0,
          (size_t)ctx->C,(uint8_t *)(ulong)uStack_10,unaff_RBX);
  ctx->reseed_counter = 1;
  return;
}

Assistant:

void cf_hash_drbg_sha256_init(cf_hash_drbg_sha256 *ctx,
                              const void *entropy, size_t nentropy,
                              const void *nonce, size_t nnonce,
                              const void *persn, size_t npersn)
{
  mem_clean(ctx, sizeof *ctx);

  /* 1. seed_material = entropy_input || nonce || personalization_string
   * 2. seed = Hash_df(seed_material, seedlen)
   * 3. V = seed */
  hash_df(&cf_sha256,
          entropy, nentropy,
          nonce, nnonce,
          persn, npersn,
          NULL, 0,
          ctx->V, sizeof ctx->V);

  /* 4. C = Hash_df(0x00 || V, seedlen) */
  uint8_t zero = 0;
  hash_df(&cf_sha256,
          &zero, sizeof zero,
          ctx->V, sizeof ctx->V,
          NULL, 0,
          NULL, 0,
          ctx->C, sizeof ctx->C);

  /* 5. reseed_counter = 1 */
  ctx->reseed_counter = 1;
}